

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

Reg __thiscall backend::codegen::Codegen::get_or_alloc_vd(Codegen *this,VarId *v_)

{
  _Rb_tree_header *p_Var1;
  uint32_t num;
  RegisterKind RVar2;
  Reg RVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  VarId v;
  undefined1 local_60 [24];
  uint32_t local_48;
  Reg local_40;
  undefined **local_38;
  uint32_t local_30;
  
  local_38 = &PTR_display_001ee058;
  local_30 = v_->id;
  get_collapsed_var((Codegen *)local_60,(VarId *)this);
  p_Var1 = &(this->reg_map)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->reg_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[bVar6]) {
    bVar6 = *(uint *)&p_Var5[1]._M_parent < (uint)local_60._8_4_;
    if (!bVar6) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (p_Var5 = p_Var4, (uint)local_60._8_4_ < *(uint *)&p_Var4[1]._M_parent)) {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    num = this->vreg_vd_counter;
    this->vreg_vd_counter = num + 1;
    RVar3 = arm::make_register(VirtualDoubleVector,num);
    local_60._16_8_ = &PTR_display_001ee058;
    local_48 = local_60._8_4_;
    local_40 = RVar3;
    std::
    _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,unsigned_int>,std::_Select1st<std::pair<mir::inst::VarId_const,unsigned_int>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>
    ::_M_insert_unique<std::pair<mir::inst::VarId_const,unsigned_int>>
              ((_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,unsigned_int>,std::_Select1st<std::pair<mir::inst::VarId_const,unsigned_int>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>
                *)&this->reg_map,(pair<const_mir::inst::VarId,_unsigned_int> *)(local_60 + 0x10));
    local_48 = v_->id;
    if (local_48 != local_60._8_4_) {
      local_60._16_8_ = &PTR_display_001ee058;
      local_40 = RVar3;
      std::
      _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,unsigned_int>,std::_Select1st<std::pair<mir::inst::VarId_const,unsigned_int>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>
      ::_M_insert_unique<std::pair<mir::inst::VarId_const,unsigned_int>>
                ((_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,unsigned_int>,std::_Select1st<std::pair<mir::inst::VarId_const,unsigned_int>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>
                  *)&this->reg_map,(pair<const_mir::inst::VarId,_unsigned_int> *)(local_60 + 0x10));
    }
  }
  else {
    RVar2 = arm::register_type(*(Reg *)&p_Var5[1]._M_left);
    if (RVar2 != VirtualDoubleVector) {
      __assert_fail("arm::register_type(found->second) == arm::RegisterKind::VirtualDoubleVector",
                    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                    ,0x135,"arm::Reg backend::codegen::Codegen::get_or_alloc_vd(mir::inst::VarId)");
    }
    RVar3 = *(Reg *)&p_Var5[1]._M_left;
  }
  return RVar3;
}

Assistant:

arm::Reg Codegen::get_or_alloc_vd(mir::inst::VarId v_) {
  auto v = get_collapsed_var(v_);
  auto found = reg_map.find(v);
  if (found != reg_map.end()) {
    assert(arm::register_type(found->second) ==
           arm::RegisterKind::VirtualDoubleVector);
    return found->second;
  } else {
    auto reg = alloc_vd();
    reg_map.insert({v, reg});
    if (v_ != v) reg_map.insert({v_, reg});
    return reg;
  }
}